

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::PointCoordCase::iterate(PointCoordCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderContext *pRVar2;
  ulong uVar3;
  PointCoordCase *pPVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  RenderTarget *pRVar9;
  pointer pbVar10;
  pointer pbVar11;
  TestError *pTVar12;
  ulong uVar13;
  char *description;
  long lVar14;
  int iVar15;
  int iVar16;
  iterator coord;
  int iVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float pointSizeRange [2];
  Surface refImg;
  Surface testImg;
  Random rnd;
  ProgramSources sources;
  ShaderProgram program;
  undefined8 local_2c8;
  PointCoordCase *local_2c0;
  undefined1 local_2b8 [8];
  char *pcStack_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  int local_290;
  value_type local_280;
  Surface local_260;
  float local_244;
  float local_240;
  int local_23c;
  int local_238;
  RGBA local_234;
  TestLog *local_230;
  pointer local_228;
  pointer local_220;
  ulong local_218;
  Surface local_210;
  deRandom local_1f8;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  undefined1 local_1d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  int local_1c0;
  pointer local_1b8;
  pointer pbStack_1b0;
  int local_1a8;
  pointer local_1a0;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_158;
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  ShaderProgram local_100;
  long lVar8;
  
  local_230 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar9->m_width;
  if (0xff < iVar6) {
    iVar6 = 0x100;
  }
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar16 = 0x100;
  if (pRVar9->m_height < 0x100) {
    iVar16 = pRVar9->m_height;
  }
  pbVar10 = (pointer)operator_new(0x60);
  (pbVar10->_M_dataplus)._M_p = (pointer)0x0;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pbVar10->field_2 + 8) = 0;
  pbVar10[1]._M_dataplus._M_p = (pointer)0x0;
  pbVar10[1]._M_string_length = 0;
  pbVar10[1].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pbVar10[1].field_2 + 8) = 0;
  pbVar10[2]._M_dataplus._M_p = (pointer)0x0;
  pbVar10[2]._M_string_length = 0;
  pbVar10[2].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pbVar10[2].field_2 + 8) = 0;
  local_2c8 = 0;
  deRandom_init(&local_1f8,0x145fa);
  tcu::Surface::Surface(&local_210,iVar6,iVar16);
  tcu::Surface::Surface(&local_260,iVar6,iVar16);
  (**(code **)(lVar8 + 0x818))(0x846d,&local_2c8);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glGetFloatv(GL_ALIASED_POINT_SIZE_RANGE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                  ,0x1db);
  if ((((float)local_2c8 <= 0.0) || (local_2c8._4_4_ <= 0.0)) ||
     (local_2c8._4_4_ < (float)local_2c8)) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)&local_100.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Invalid GL_ALIASED_POINT_SIZE_RANGE","");
    tcu::TestError::TestError(pTVar12,(string *)&local_100);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_228 = pbVar10 + 3;
  pbVar11 = pbVar10;
  do {
    fVar20 = deRandom_getFloat(&local_1f8);
    *(float *)&(pbVar11->_M_dataplus)._M_p = fVar20 * 1.8 + -0.9;
    fVar20 = deRandom_getFloat(&local_1f8);
    *(float *)((long)&(pbVar11->_M_dataplus)._M_p + 4) = fVar20 * 1.8 + -0.9;
    fVar20 = (float)local_2c8;
    fVar22 = local_2c8._4_4_;
    fVar21 = deRandom_getFloat(&local_1f8);
    *(float *)&pbVar11->_M_string_length = (fVar22 - fVar20) * fVar21 + fVar20;
    pbVar11 = (pointer)((long)&pbVar11->_M_string_length + 4);
  } while (pbVar11 != local_228);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2c0 = this;
  local_2b8 = (undefined1  [8])&local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b8,
             "attribute highp vec3 a_positionSize;\nvoid main (void)\n{\n\tgl_Position = vec4(a_positionSize.xy, 0.0, 1.0);\n\tgl_PointSize = a_positionSize.z;\n}\n"
             ,"");
  paVar1 = &local_280.field_2;
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,
             "void main (void)\n{\n\tgl_FragColor = vec4(gl_PointCoord, 0.0, 1.0);\n}\n","");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1e8,0,0xac);
  local_138._0_8_ = (pointer)0x0;
  local_138[8] = 0;
  local_138._9_7_ = 0;
  local_138[0x10] = 0;
  local_138._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d0,&local_280);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar2,(ProgramSources *)local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_158);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1e8 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
  }
  glu::operator<<(local_230,&local_100);
  if (local_100.m_program.m_info.linkOk != false) {
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"a_positionSize","");
    local_2b8._0_4_ = A;
    pcStack_2b0 = local_2a8._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pcStack_2b0,local_280._M_dataplus._M_p,
               local_280._M_dataplus._M_p + local_280._M_string_length);
    local_290 = 0;
    local_1e8._0_4_ = local_2b8._0_4_;
    local_1e0._M_p = (pointer)&local_1d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcStack_2b0,pcStack_2b0 + local_2a8._M_allocated_capacity);
    local_1c0 = local_290;
    local_1b8 = (pointer)0x8;
    pbStack_1b0 = (pointer)0x800000003;
    local_1a8 = 0;
    local_1a0 = pbVar10;
    if (pcStack_2b0 != local_2a8._M_local_buf + 8) {
      operator_delete(pcStack_2b0,local_2a8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    pRVar9 = Context::getRenderTarget((local_2c0->super_TestCase).m_context);
    iVar15 = pRVar9->m_width;
    dVar7 = deRandom_getUint32(&local_1f8);
    uVar13 = (ulong)dVar7 % (ulong)((iVar15 - iVar6) + 1);
    pRVar9 = Context::getRenderTarget((local_2c0->super_TestCase).m_context);
    iVar15 = pRVar9->m_height;
    dVar7 = deRandom_getUint32(&local_1f8);
    uVar3 = (ulong)dVar7 % (ulong)((iVar15 - iVar16) + 1);
    (**(code **)(lVar8 + 0x1a00))(uVar13,uVar3,iVar6,iVar16);
    (**(code **)(lVar8 + 0x1c0))();
    (**(code **)(lVar8 + 0x188))(0x4000);
    (**(code **)(lVar8 + 0x1680))(local_100.m_program.m_program);
    pPVar4 = local_2c0;
    local_2b8._0_4_ = RA;
    local_2b8._4_4_ = UNORM_SHORT_565;
    pcStack_2b0 = (char *)CONCAT44(pcStack_2b0._4_4_,3);
    local_2a8._M_allocated_capacity = 0;
    glu::draw(((local_2c0->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
              (VertexArrayBinding *)local_1e8,(PrimitiveList *)local_2b8,(DrawUtilCallback *)0x0);
    pRVar2 = ((pPVar4->super_TestCase).m_context)->m_renderCtx;
    local_280._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_210.m_pixels.m_cap != (void *)0x0) {
      local_210.m_pixels.m_cap = (size_t)local_210.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2b8,(TextureFormat *)&local_280,local_210.m_width,
               local_210.m_height,1,(void *)local_210.m_pixels.m_cap);
    glu::readPixels(pRVar2,(int)uVar13,(int)uVar3,(PixelBufferAccess *)local_2b8);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                    ,0x20d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    local_2b8._0_4_ = RGBA;
    local_2b8._4_4_ = UNORM_INT8;
    if ((void *)local_260.m_pixels.m_cap != (void *)0x0) {
      local_260.m_pixels.m_cap = (size_t)local_260.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1e8,(TextureFormat *)local_2b8,local_260.m_width,
               local_260.m_height,1,(void *)local_260.m_pixels.m_cap);
    local_2b8._0_4_ = R;
    local_2b8._4_4_ = SNORM_INT8;
    pcStack_2b0 = (char *)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_1e8,(Vec4 *)local_2b8);
    local_244 = (float)iVar6;
    local_118 = (float)iVar16;
    pbVar11 = pbVar10;
    fStack_114 = local_118;
    fStack_110 = local_118;
    fStack_10c = local_118;
    do {
      fVar21 = *(float *)((long)&(pbVar11->_M_dataplus)._M_p + 4) * 0.5 + 0.5;
      fVar20 = *(float *)&pbVar11->_M_string_length * 0.5;
      fVar22 = *(float *)&pbVar11->_M_string_length * -0.5;
      fVar23 = fVar21 * local_118 + fVar20;
      fVar21 = fVar21 * fStack_114 + fVar22;
      uVar18 = -(uint)(fVar23 < 0.0);
      uVar19 = -(uint)(fVar21 < 0.0);
      uVar19 = (uint)((float)(uVar19 & 0xbf000000 | ~uVar19 & 0x3f000000) + fVar21);
      uVar13 = (ulong)uVar19;
      uVar19 = (int)((float)(uVar18 & 0xbf000000 | ~uVar18 & 0x3f000000) + fVar23) - uVar19;
      local_220 = pbVar11;
      local_218 = uVar13;
      if (0 < (int)uVar19) {
        fVar21 = (*(float *)&(pbVar11->_M_dataplus)._M_p * 0.5 + 0.5) * local_244;
        fVar22 = fVar22 + fVar21;
        uVar18 = -(uint)(fVar22 < 0.0);
        local_23c = (int)((float)(~uVar18 & 0x3f000000 | uVar18 & 0xbf000000) + fVar22);
        fVar21 = fVar21 + fVar20;
        uVar18 = -(uint)(fVar21 < 0.0);
        iVar6 = (int)((float)(~uVar18 & 0x3f000000 | uVar18 & 0xbf000000) + fVar21);
        local_238 = iVar6 - local_23c;
        fVar20 = (float)local_238;
        local_240 = (float)(int)uVar19;
        uVar18 = 0;
        do {
          if (0 < local_238) {
            fVar22 = ((float)(int)(~uVar18 + uVar19) + 0.5) / local_240;
            iVar15 = (int)local_218 + uVar18;
            iVar17 = 0;
            iVar16 = local_23c;
            do {
              local_1e8._4_4_ = fVar22;
              local_1e8._0_4_ = ((float)iVar17 + 0.5) / fVar20;
              local_1e0._M_p = (pointer)0x3f80000000000000;
              if (((-1 < iVar16) && (iVar16 < local_260.m_width)) &&
                 ((-1 < iVar15 && (iVar15 < local_260.m_height)))) {
                tcu::RGBA::RGBA(&local_234,(Vec4 *)local_1e8);
                *(deUint32 *)
                 ((long)local_260.m_pixels.m_ptr +
                 (long)(local_260.m_width * (int)uVar13 + iVar16) * 4) = local_234.m_value;
              }
              iVar17 = iVar17 + 1;
              iVar16 = iVar16 + 1;
            } while (iVar6 != iVar16);
          }
          uVar18 = uVar18 + 1;
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (uVar18 != uVar19);
      }
      pbVar11 = (pointer)((long)&local_220->_M_string_length + 4);
    } while (pbVar11 != local_228);
    bVar5 = tcu::fuzzyCompare(local_230,"Result","Image comparison result",&local_260,&local_210,
                              0.02,COMPARE_LOG_RESULT);
    description = "Image comparison failed";
    if (bVar5) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_2c0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,
               description);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    tcu::Surface::~Surface(&local_260);
    tcu::Surface::~Surface(&local_210);
    operator_delete(pbVar10,0x60);
    return STOP;
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Compile failed","");
  tcu::TestError::TestError(pTVar12,(string *)local_1e8);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= de::min(256, m_context.getRenderTarget().getWidth());
		const int				height		= de::min(256, m_context.getRenderTarget().getHeight());
		const float				threshold	= 0.02f;

		const int				numPoints	= 8;

		vector<tcu::Vec3>		coords		(numPoints);
		float					pointSizeRange[2]	= { 0.0f, 0.0f };

		de::Random				rnd			(0x145fa);
		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		gl.getFloatv(GL_ALIASED_POINT_SIZE_RANGE, &pointSizeRange[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv(GL_ALIASED_POINT_SIZE_RANGE)");

		if (pointSizeRange[0] <= 0.0f || pointSizeRange[1] <= 0.0f || pointSizeRange[1] < pointSizeRange[0])
			throw tcu::TestError("Invalid GL_ALIASED_POINT_SIZE_RANGE");

		// Compute coordinates.
		{

			for (vector<tcu::Vec3>::iterator coord = coords.begin(); coord != coords.end(); ++coord)
			{
				coord->x() = rnd.getFloat(-0.9f, 0.9f);
				coord->y() = rnd.getFloat(-0.9f, 0.9f);
				coord->z() = rnd.getFloat(pointSizeRange[0], pointSizeRange[1]);
			}
		}

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"attribute highp vec3 a_positionSize;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(a_positionSize.xy, 0.0, 1.0);\n"
			"	gl_PointSize = a_positionSize.z;\n"
			"}\n",

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(gl_PointCoord, 0.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_positionSize", 3, (int)coords.size(), 0, (const float*)&coords[0]);
			const int				viewportX	= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
			const int				viewportY	= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);

			gl.viewport(viewportX, viewportY, width, height);
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);

			gl.useProgram(program.getProgram());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Points((int)coords.size()));

			glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		tcu::clear(refImg.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		for (vector<tcu::Vec3>::const_iterator pointIter = coords.begin(); pointIter != coords.end(); ++pointIter)
		{
			const int	x0		= deRoundFloatToInt32(float(width) *(pointIter->x()*0.5f + 0.5f) - pointIter->z()*0.5f);
			const int	y0		= deRoundFloatToInt32(float(height)*(pointIter->y()*0.5f + 0.5f) - pointIter->z()*0.5f);
			const int	x1		= deRoundFloatToInt32(float(width) *(pointIter->x()*0.5f + 0.5f) + pointIter->z()*0.5f);
			const int	y1		= deRoundFloatToInt32(float(height)*(pointIter->y()*0.5f + 0.5f) + pointIter->z()*0.5f);
			const int	w		= x1-x0;
			const int	h		= y1-y0;

			for (int yo = 0; yo < h; yo++)
			{
				for (int xo = 0; xo < w; xo++)
				{
					const float			xf		= (float(xo)+0.5f) / float(w);
					const float			yf		= (float(h-yo-1)+0.5f) / float(h);
					const tcu::Vec4		color	(xf, yf, 0.0f, 1.0f);
					const int			dx		= x0+xo;
					const int			dy		= y0+yo;

					if (de::inBounds(dx, 0, refImg.getWidth()) && de::inBounds(dy, 0, refImg.getHeight()))
						refImg.setPixel(dx, dy, tcu::RGBA(color));
				}
			}
		}

		// Compare
		{
			bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}